

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

bool kratos::is_relational_op(ExprOp op)

{
  int iVar1;
  iterator iVar2;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [8];
  ExprOp local_20;
  ExprOp op_local;
  
  local_20 = op;
  if (is_relational_op(kratos::ExprOp)::ops == '\0') {
    iVar1 = __cxa_guard_acquire(&is_relational_op(kratos::ExprOp)::ops);
    if (iVar1 != 0) {
      local_38 = 0x19;
      uStack_30 = 0x1a;
      local_48 = 0x17;
      uStack_40 = 0x18;
      local_58 = 0x15;
      uStack_54 = 0;
      uStack_50 = 0x16;
      uStack_4c = 0;
      std::
      _Hashtable<kratos::ExprOp,kratos::ExprOp,std::allocator<kratos::ExprOp>,std::__detail::_Identity,std::equal_to<kratos::ExprOp>,std::hash<kratos::ExprOp>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_Hashtable<kratos::ExprOp_const*>
                ((_Hashtable<kratos::ExprOp,kratos::ExprOp,std::allocator<kratos::ExprOp>,std::__detail::_Identity,std::equal_to<kratos::ExprOp>,std::hash<kratos::ExprOp>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&is_relational_op::ops,&local_58,local_28,0,(byte *)((long)&op_local + 5),
                 (byte *)((long)&op_local + 6),(byte *)((long)&op_local + 7));
      __cxa_atexit(std::
                   unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
                   ::~unordered_set,&is_relational_op::ops,&__dso_handle);
      __cxa_guard_release(&is_relational_op(kratos::ExprOp)::ops);
    }
  }
  iVar2 = std::
          _Hashtable<kratos::ExprOp,_kratos::ExprOp,_std::allocator<kratos::ExprOp>,_std::__detail::_Identity,_std::equal_to<kratos::ExprOp>,_std::hash<kratos::ExprOp>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&is_relational_op::ops._M_h,&local_20);
  return iVar2.super__Node_iterator_base<kratos::ExprOp,_false>._M_cur != (__node_type *)0x0;
}

Assistant:

bool is_relational_op(ExprOp op) {
    static std::unordered_set<ExprOp> ops = {ExprOp::LessThan,   ExprOp::GreaterThan,
                                             ExprOp::LessEqThan, ExprOp::GreaterEqThan,
                                             ExprOp::Eq,         ExprOp::Neq};
    return ops.find(op) != ops.end();
}